

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.hpp
# Opt level: O0

void qclab::dense::kron<qclab::dense::SquareMatrix<std::complex<double>>>
               (SquareMatrix<std::complex<double>_> *A,SquareMatrix<std::complex<double>_> *B,
               SquareMatrix<std::complex<double>_> *kronAB)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  complex<double> *pcVar6;
  complex<double> *__y;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 uVar7;
  long local_60;
  int64_t l;
  int64_t j;
  int64_t k;
  int64_t i;
  int64_t colsB;
  int64_t rowsB;
  int64_t colsA;
  int64_t rowsA;
  SquareMatrix<std::complex<double>_> *kronAB_local;
  SquareMatrix<std::complex<double>_> *B_local;
  SquareMatrix<std::complex<double>_> *A_local;
  
  iVar1 = SquareMatrix<std::complex<double>_>::rows(A);
  iVar2 = SquareMatrix<std::complex<double>_>::cols(A);
  iVar3 = SquareMatrix<std::complex<double>_>::rows(B);
  iVar4 = SquareMatrix<std::complex<double>_>::cols(B);
  iVar5 = SquareMatrix<std::complex<double>_>::rows(kronAB);
  if (iVar5 != iVar1 * iVar3) {
    __assert_fail("kronAB.rows() == rowsA * rowsB",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/kron.hpp"
                  ,0x12,
                  "void qclab::dense::kron(const T &, const T &, T &) [T = qclab::dense::SquareMatrix<std::complex<double>>]"
                 );
  }
  iVar5 = SquareMatrix<std::complex<double>_>::cols(kronAB);
  if (iVar5 == iVar2 * iVar4) {
    for (k = 0; k < iVar1; k = k + 1) {
      for (j = 0; j < iVar3; j = j + 1) {
        for (l = 0; l < iVar2; l = l + 1) {
          for (local_60 = 0; local_60 < iVar4; local_60 = local_60 + 1) {
            pcVar6 = SquareMatrix<std::complex<double>_>::operator()(A,k,l);
            __y = SquareMatrix<std::complex<double>_>::operator()(B,j,local_60);
            std::operator*(pcVar6,__y);
            uVar7 = in_XMM1_Qa;
            pcVar6 = SquareMatrix<std::complex<double>_>::operator()
                               (kronAB,k * iVar3 + j,l * iVar4 + local_60);
            *(undefined8 *)pcVar6->_M_value = extraout_XMM0_Qa;
            *(undefined8 *)(pcVar6->_M_value + 8) = in_XMM1_Qa;
            in_XMM1_Qa = uVar7;
          }
        }
      }
    }
    return;
  }
  __assert_fail("kronAB.cols() == colsA * colsB",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/kron.hpp"
                ,0x13,
                "void qclab::dense::kron(const T &, const T &, T &) [T = qclab::dense::SquareMatrix<std::complex<double>>]"
               );
}

Assistant:

void kron( const T& A , const T& B , T& kronAB ) {
      const int64_t rowsA = A.rows() ;
      const int64_t colsA = A.cols() ;
      const int64_t rowsB = B.rows() ;
      const int64_t colsB = B.cols() ;
      assert( kronAB.rows() == rowsA * rowsB ) ;
      assert( kronAB.cols() == colsA * colsB ) ;
      #pragma omp parallel for
      for ( int64_t i = 0; i < rowsA; i++ ) {        // i loops over rows of A
        for ( int64_t k = 0; k < rowsB; k++ ) {      // k loops over rows of B
          for ( int64_t j = 0; j < colsA; j++ ) {    // j loops over cols of A
            for ( int64_t l = 0; l < colsB; l++ ) {  // l loops over cols of B
              kronAB( i*rowsB + k , j*colsB + l ) = A(i,j) * B(k,l) ;
            }
          }
        }
      }
    }